

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Config.h
# Opt level: O2

int LoadEnv(void)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  FILE *__stream;
  char *pcVar5;
  interval *piVar6;
  double d0;
  double d2;
  double d1;
  box local_500;
  double d3;
  double local_4e8;
  double local_4e0;
  double local_4d8;
  double local_4d0;
  interval local_4c8;
  interval local_4b0;
  interval local_498;
  interval local_480;
  interval local_468;
  interval local_450;
  char line [1024];
  
  d0 = 0.0;
  d1 = 0.0;
  d2 = 0.0;
  d3 = 0.0;
  memset(line,0,0x400);
  angle_env = 0.0;
  lat_env = 0.0;
  long_env = 0.0;
  alt_env = 0.0;
  MagneticDeclination = 0.0;
  AirPressure = 1.0;
  WaterVelocityOfSound = 1500.0;
  WaterFloorAltitude = 0.0;
  nb_circles = 0;
  if (circles_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      circles_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    circles_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = circles_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
  }
  if (circles_y.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      circles_y.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    circles_y.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = circles_y.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
  }
  if (circles_r.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      circles_r.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    circles_r.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = circles_r.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
  }
  nb_walls = 0;
  if (walls_xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      walls_xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    walls_xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = walls_xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
  }
  if (walls_ya.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      walls_ya.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    walls_ya.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = walls_ya.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
  }
  if (walls_xb.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      walls_xb.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    walls_xb.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = walls_xb.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
  }
  if (walls_yb.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      walls_yb.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    walls_yb.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = walls_yb.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
  }
  local_4d0 = -10.0;
  local_4d8 = 10.0;
  interval::interval(&local_450,&local_4d0,&local_4d8);
  local_4e0 = -10.0;
  local_4e8 = 10.0;
  interval::interval(&local_468,&local_4e0,&local_4e8);
  box::box(&local_500,(vector<interval,_std::allocator<interval>_> *)&local_450,
           (vector<interval,_std::allocator<interval>_> *)&local_468);
  box::operator=(&box_env,&local_500);
  box::~box(&local_500);
  csMap.xMin = -10.0;
  csMap.xMax = 10.0;
  csMap.yMin = -10.0;
  csMap.yMax = 10.0;
  __stream = fopen("env.txt","r");
  if (__stream == (FILE *)0x0) {
    puts("Configuration file not found.");
    return 1;
  }
  pcVar5 = fgets3((FILE *)__stream,line,0x400);
  if (pcVar5 == (char *)0x0) {
    puts("Error reading parameter : d0.");
  }
  iVar3 = __isoc99_sscanf(line,"%lf",&d0);
  if (iVar3 != 1) {
    puts("Invalid parameter : d0.");
  }
  angle_env = (d0 * -3.141592653589793) / 180.0 + 1.5707963267948966;
  pcVar5 = fgets3((FILE *)__stream,line,0x400);
  if (pcVar5 == (char *)0x0) {
    puts("Error reading parameter : lat_env.");
  }
  iVar3 = __isoc99_sscanf(line,"%lf",&lat_env);
  if (iVar3 != 1) {
    puts("Invalid parameter : lat_env.");
  }
  pcVar5 = fgets3((FILE *)__stream,line,0x400);
  if (pcVar5 == (char *)0x0) {
    puts("Error reading parameter : long_env.");
  }
  iVar3 = __isoc99_sscanf(line,"%lf",&long_env);
  if (iVar3 != 1) {
    puts("Invalid parameter : long_env.");
  }
  pcVar5 = fgets3((FILE *)__stream,line,0x400);
  if (pcVar5 == (char *)0x0) {
    puts("Error reading parameter : alt_env.");
  }
  iVar3 = __isoc99_sscanf(line,"%lf",&alt_env);
  if (iVar3 != 1) {
    puts("Invalid parameter : alt_env.");
  }
  pcVar5 = fgets3((FILE *)__stream,line,0x400);
  if (pcVar5 == (char *)0x0) {
    puts("Error reading parameter : MagneticDeclination.");
  }
  iVar3 = __isoc99_sscanf(line,"%lf",&MagneticDeclination);
  if (iVar3 != 1) {
    puts("Invalid parameter : MagneticDeclination.");
  }
  pcVar5 = fgets3((FILE *)__stream,line,0x400);
  if (pcVar5 == (char *)0x0) {
    puts("Error reading parameter : AirPressure.");
  }
  iVar3 = __isoc99_sscanf(line,"%lf",&AirPressure);
  if (iVar3 != 1) {
    puts("Invalid parameter : AirPressure.");
  }
  pcVar5 = fgets3((FILE *)__stream,line,0x400);
  if (pcVar5 == (char *)0x0) {
    puts("Error reading parameter : WaterVelocityOfSound.");
  }
  iVar3 = __isoc99_sscanf(line,"%lf",&WaterVelocityOfSound);
  if (iVar3 != 1) {
    puts("Invalid parameter : WaterVelocityOfSound.");
  }
  pcVar5 = fgets3((FILE *)__stream,line,0x400);
  if (pcVar5 == (char *)0x0) {
    puts("Error reading parameter : WaterFloorAltitude.");
  }
  iVar3 = __isoc99_sscanf(line,"%lf",&WaterFloorAltitude);
  if (iVar3 != 1) {
    puts("Invalid parameter : WaterFloorAltitude.");
  }
  pcVar5 = fgets3((FILE *)__stream,line,0x400);
  if (pcVar5 == (char *)0x0) {
    puts("Error reading parameter : nb_circles.");
  }
  iVar3 = __isoc99_sscanf(line,"%d",&nb_circles);
  if (iVar3 != 1) {
    puts("Invalid parameter : nb_circles.");
  }
  for (iVar3 = 0; iVar4 = nb_circles, pcVar5 = fgets3((FILE *)__stream,line,0x400), iVar3 < iVar4;
      iVar3 = iVar3 + 1) {
    if (pcVar5 == (char *)0x0) {
      puts("Error reading parameter : circles.");
    }
    iVar4 = __isoc99_sscanf(line,"%lf %lf %lf",&d0,&d1,&d2);
    if (iVar4 != 3) {
      puts("Invalid parameter : circles.");
    }
    std::vector<double,_std::allocator<double>_>::push_back(&circles_x,&d0);
    std::vector<double,_std::allocator<double>_>::push_back(&circles_y,&d1);
    std::vector<double,_std::allocator<double>_>::push_back(&circles_r,&d2);
  }
  if (pcVar5 == (char *)0x0) {
    puts("Error reading parameter : nb_walls.");
  }
  iVar3 = __isoc99_sscanf(line,"%d",&nb_walls);
  if (iVar3 != 1) {
    puts("Invalid parameter : nb_walls.");
  }
  for (iVar3 = 0; iVar4 = nb_walls, pcVar5 = fgets3((FILE *)__stream,line,0x400), iVar3 < iVar4;
      iVar3 = iVar3 + 1) {
    if (pcVar5 == (char *)0x0) {
      puts("Error reading parameter : walls.");
    }
    iVar4 = __isoc99_sscanf(line,"%lf %lf %lf %lf",&d0,&d1,&d2,&d3);
    if (iVar4 != 4) {
      puts("Invalid parameter : walls.");
    }
    std::vector<double,_std::allocator<double>_>::push_back(&walls_xa,&d0);
    std::vector<double,_std::allocator<double>_>::push_back(&walls_ya,&d1);
    std::vector<double,_std::allocator<double>_>::push_back(&walls_xb,&d2);
    std::vector<double,_std::allocator<double>_>::push_back(&walls_yb,&d3);
  }
  if (pcVar5 == (char *)0x0) {
    puts("Error reading parameter : d0.");
  }
  iVar3 = __isoc99_sscanf(line,"%lf",&d0);
  if (iVar3 != 1) {
    puts("Invalid parameter : d0.");
  }
  pcVar5 = fgets3((FILE *)__stream,line,0x400);
  if (pcVar5 == (char *)0x0) {
    puts("Error reading parameter : d1.");
  }
  iVar3 = __isoc99_sscanf(line,"%lf",&d1);
  if (iVar3 != 1) {
    puts("Invalid parameter : d1.");
  }
  pcVar5 = fgets3((FILE *)__stream,line,0x400);
  if (pcVar5 == (char *)0x0) {
    puts("Error reading parameter : d2.");
  }
  iVar3 = __isoc99_sscanf(line,"%lf",&d2);
  if (iVar3 != 1) {
    puts("Invalid parameter : d2.");
  }
  pcVar5 = fgets3((FILE *)__stream,line,0x400);
  if (pcVar5 == (char *)0x0) {
    puts("Error reading parameter : d3.");
  }
  iVar3 = __isoc99_sscanf(line,"%lf",&d3);
  if (iVar3 != 1) {
    puts("Invalid parameter : d3.");
  }
  interval::interval(&local_480,&d0,&d1);
  interval::interval(&local_498,&d2,&d3);
  box::box(&local_500,(vector<interval,_std::allocator<interval>_> *)&local_480,
           (vector<interval,_std::allocator<interval>_> *)&local_498);
  box::operator=(&box_env,&local_500);
  box::~box(&local_500);
  pcVar5 = fgets3((FILE *)__stream,line,0x400);
  if (pcVar5 == (char *)0x0) {
    puts("Error reading parameter : csMap.xMin.");
  }
  iVar3 = __isoc99_sscanf(line,"%lf");
  if (iVar3 != 1) {
    puts("Invalid parameter : csMap.xMin.");
  }
  pcVar5 = fgets3((FILE *)__stream,line,0x400);
  if (pcVar5 == (char *)0x0) {
    puts("Error reading parameter : csMap.xMax.");
  }
  iVar3 = __isoc99_sscanf(line,"%lf",0x1cc918);
  if (iVar3 != 1) {
    puts("Invalid parameter : csMap.xMax.");
  }
  pcVar5 = fgets3((FILE *)__stream,line,0x400);
  if (pcVar5 == (char *)0x0) {
    puts("Error reading parameter : csMap.yMin.");
  }
  iVar3 = __isoc99_sscanf(line,"%lf",0x1cc920);
  if (iVar3 != 1) {
    puts("Invalid parameter : csMap.yMin.");
  }
  pcVar5 = fgets3((FILE *)__stream,line,0x400);
  if (pcVar5 == (char *)0x0) {
    puts("Error reading parameter : csMap.yMax.");
  }
  iVar3 = __isoc99_sscanf(line,"%lf",0x1cc928);
  if (iVar3 != 1) {
    puts("Invalid parameter : csMap.yMax.");
  }
  iVar3 = fclose(__stream);
  if (iVar3 != 0) {
    puts("fclose() failed.");
  }
  if (180.0 < ABS(MagneticDeclination)) {
    puts("Invalid parameter : MagneticDeclination.");
    MagneticDeclination = 0.0;
  }
  if ((AirPressure < 0.0) || (1000.0 < AirPressure)) {
    puts("Invalid parameter : AirPressure.");
    AirPressure = 1.0;
  }
  if ((WaterVelocityOfSound < 200.0) || (2000.0 < WaterVelocityOfSound)) {
    puts("Invalid parameter : WaterVelocityOfSound.");
    WaterVelocityOfSound = 1500.0;
  }
  if ((((nb_circles < 0) ||
       (nb_circles !=
        (int)((ulong)((long)circles_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)circles_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 3))) ||
      (nb_circles !=
       (int)((ulong)((long)circles_y.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)circles_y.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 3))) ||
     (nb_circles !=
      (int)((ulong)((long)circles_r.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)circles_r.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 3))) {
    puts("Invalid parameter : nb_circles.");
    nb_circles = 0;
    if (circles_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        circles_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start) {
      circles_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = circles_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
    }
    if (circles_y.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        circles_y.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start) {
      circles_y.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = circles_y.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
    }
    if (circles_r.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        circles_r.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start) {
      circles_r.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = circles_r.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
    }
  }
  if (((nb_walls < 0) ||
      (nb_walls !=
       (int)((ulong)((long)walls_xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)walls_xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 3))) ||
     ((nb_walls !=
       (int)((ulong)((long)walls_ya.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)walls_ya.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 3) ||
      ((nb_walls !=
        (int)((ulong)((long)walls_xb.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)walls_xb.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 3) ||
       (nb_walls !=
        (int)((ulong)((long)walls_yb.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)walls_yb.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 3))))))) {
    puts("Invalid parameter : nb_walls.");
    nb_walls = 0;
    if (walls_xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish !=
        walls_xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start) {
      walls_xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = walls_xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
    }
    if (walls_ya.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish !=
        walls_ya.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start) {
      walls_ya.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = walls_ya.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
    }
    if (walls_xb.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish !=
        walls_xb.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start) {
      walls_xb.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = walls_xb.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
    }
    if (walls_yb.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish !=
        walls_yb.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start) {
      walls_yb.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = walls_yb.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
    }
  }
  bVar2 = box::IsEmpty(&box_env);
  if (!bVar2) {
    piVar6 = box::operator[](&box_env,1);
    dVar1 = piVar6->inf;
    piVar6 = box::operator[](&box_env,1);
    if (dVar1 < piVar6->sup) {
      piVar6 = box::operator[](&box_env,2);
      dVar1 = piVar6->inf;
      piVar6 = box::operator[](&box_env,2);
      if (dVar1 < piVar6->sup) goto LAB_0011bfac;
    }
  }
  puts("Invalid parameter : box_env.");
  local_4d0 = -10.0;
  local_4d8 = 10.0;
  interval::interval(&local_4b0,&local_4d0,&local_4d8);
  local_4e0 = -10.0;
  local_4e8 = 10.0;
  interval::interval(&local_4c8,&local_4e0,&local_4e8);
  box::box(&local_500,(vector<interval,_std::allocator<interval>_> *)&local_4b0,
           (vector<interval,_std::allocator<interval>_> *)&local_4c8);
  box::operator=(&box_env,&local_500);
  box::~box(&local_500);
LAB_0011bfac:
  if ((csMap.xMin != csMap.xMax) || (NAN(csMap.xMin) || NAN(csMap.xMax))) {
    if (csMap.yMin != csMap.yMax) {
      lat_home = lat_env;
      long_home = long_env;
      alt_home = alt_env;
      return 0;
    }
    if (NAN(csMap.yMin) || NAN(csMap.yMax)) {
      lat_home = lat_env;
      long_home = long_env;
      alt_home = alt_env;
      return 0;
    }
  }
  puts("Invalid parameter : csMap.");
  csMap.yMax = 10.0;
  csMap.yMin = -10.0;
  csMap.xMax = 10.0;
  csMap.xMin = -10.0;
  alt_home = alt_env;
  long_home = long_env;
  lat_home = lat_env;
  return 0;
}

Assistant:

inline int LoadEnv(void)
{
	FILE* file = NULL;
	char line[1024];
	int i = 0;
	double d0 = 0, d1 = 0, d2 = 0, d3 = 0;

	// Missing error checking...

	memset(line, 0, sizeof(line));

	// Default values.
	angle_env = M_PI/2.0-90.0*M_PI/180.0;
	lat_env = 0;
	long_env = 0;
	alt_env = 0;
	MagneticDeclination = 0;
	AirPressure = 1;
	WaterVelocityOfSound = 1500;
	WaterFloorAltitude = 0;
	nb_circles = 0;
	circles_x.clear();
	circles_y.clear();
	circles_r.clear();
	nb_walls = 0;
	walls_xa.clear();
	walls_ya.clear();
	walls_xb.clear();
	walls_yb.clear();
	box_env = box(interval(-10,10),interval(-10,10));
	csMap.xMin = -10; csMap.xMax = 10; csMap.yMin = -10; csMap.yMax = 10; 

	file = fopen("env.txt", "r");
	if (file != NULL)
	{
		if (fgets3(file, line, sizeof(line)) == NULL) printf("Error reading parameter : d0.\n");
		if (sscanf(line, "%lf", &d0) != 1) printf("Invalid parameter : d0.\n");
		angle_env = M_PI/2.0-d0*M_PI/180.0;

		if (fgets3(file, line, sizeof(line)) == NULL) printf("Error reading parameter : lat_env.\n");
		if (sscanf(line, "%lf", &lat_env) != 1) printf("Invalid parameter : lat_env.\n");
		if (fgets3(file, line, sizeof(line)) == NULL) printf("Error reading parameter : long_env.\n");
		if (sscanf(line, "%lf", &long_env) != 1) printf("Invalid parameter : long_env.\n");
		if (fgets3(file, line, sizeof(line)) == NULL) printf("Error reading parameter : alt_env.\n");
		if (sscanf(line, "%lf", &alt_env) != 1) printf("Invalid parameter : alt_env.\n");
		if (fgets3(file, line, sizeof(line)) == NULL) printf("Error reading parameter : MagneticDeclination.\n");
		if (sscanf(line, "%lf", &MagneticDeclination) != 1) printf("Invalid parameter : MagneticDeclination.\n");
		if (fgets3(file, line, sizeof(line)) == NULL) printf("Error reading parameter : AirPressure.\n");
		if (sscanf(line, "%lf", &AirPressure) != 1) printf("Invalid parameter : AirPressure.\n");
		if (fgets3(file, line, sizeof(line)) == NULL) printf("Error reading parameter : WaterVelocityOfSound.\n");
		if (sscanf(line, "%lf", &WaterVelocityOfSound) != 1) printf("Invalid parameter : WaterVelocityOfSound.\n");
		if (fgets3(file, line, sizeof(line)) == NULL) printf("Error reading parameter : WaterFloorAltitude.\n");
		if (sscanf(line, "%lf", &WaterFloorAltitude) != 1) printf("Invalid parameter : WaterFloorAltitude.\n");

		if (fgets3(file, line, sizeof(line)) == NULL) printf("Error reading parameter : nb_circles.\n");
		if (sscanf(line, "%d", &nb_circles) != 1) printf("Invalid parameter : nb_circles.\n");
		for (i = 0; i < nb_circles; i++)
		{
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Error reading parameter : circles.\n");
			if (sscanf(line, "%lf %lf %lf", &d0, &d1, &d2) != 3) printf("Invalid parameter : circles.\n");
			circles_x.push_back(d0);
			circles_y.push_back(d1);
			circles_r.push_back(d2);
		}

		if (fgets3(file, line, sizeof(line)) == NULL) printf("Error reading parameter : nb_walls.\n");
		if (sscanf(line, "%d", &nb_walls) != 1) printf("Invalid parameter : nb_walls.\n");
		for (i = 0; i < nb_walls; i++)
		{
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Error reading parameter : walls.\n");
			if (sscanf(line, "%lf %lf %lf %lf", &d0, &d1, &d2, &d3) != 4) printf("Invalid parameter : walls.\n");
			walls_xa.push_back(d0);
			walls_ya.push_back(d1);
			walls_xb.push_back(d2);
			walls_yb.push_back(d3);
		}

		if (fgets3(file, line, sizeof(line)) == NULL) printf("Error reading parameter : d0.\n");
		if (sscanf(line, "%lf", &d0) != 1) printf("Invalid parameter : d0.\n");
		if (fgets3(file, line, sizeof(line)) == NULL) printf("Error reading parameter : d1.\n");
		if (sscanf(line, "%lf", &d1) != 1) printf("Invalid parameter : d1.\n");
		if (fgets3(file, line, sizeof(line)) == NULL) printf("Error reading parameter : d2.\n");
		if (sscanf(line, "%lf", &d2) != 1) printf("Invalid parameter : d2.\n");
		if (fgets3(file, line, sizeof(line)) == NULL) printf("Error reading parameter : d3.\n");
		if (sscanf(line, "%lf", &d3) != 1) printf("Invalid parameter : d3.\n");
		box_env = box(interval(d0,d1),interval(d2,d3));

		if (fgets3(file, line, sizeof(line)) == NULL) printf("Error reading parameter : csMap.xMin.\n");
		if (sscanf(line, "%lf", &csMap.xMin) != 1) printf("Invalid parameter : csMap.xMin.\n");
		if (fgets3(file, line, sizeof(line)) == NULL) printf("Error reading parameter : csMap.xMax.\n");
		if (sscanf(line, "%lf", &csMap.xMax) != 1) printf("Invalid parameter : csMap.xMax.\n");
		if (fgets3(file, line, sizeof(line)) == NULL) printf("Error reading parameter : csMap.yMin.\n");
		if (sscanf(line, "%lf", &csMap.yMin) != 1) printf("Invalid parameter : csMap.yMin.\n");
		if (fgets3(file, line, sizeof(line)) == NULL) printf("Error reading parameter : csMap.yMax.\n");
		if (sscanf(line, "%lf", &csMap.yMax) != 1) printf("Invalid parameter : csMap.yMax.\n");

		if (fclose(file) != EXIT_SUCCESS) printf("fclose() failed.\n");
	}
	else
	{
		printf("Configuration file not found.\n");
		return EXIT_FAILURE;
	}
#pragma region Parameters check
	if ((MagneticDeclination < -180)||(MagneticDeclination > 180))
	{
		printf("Invalid parameter : MagneticDeclination.\n");
		MagneticDeclination = 0;
	}
	if ((AirPressure < 0)||(AirPressure > 1000))
	{
		printf("Invalid parameter : AirPressure.\n");
		AirPressure = 1;
	}
	if ((WaterVelocityOfSound < 200)||(WaterVelocityOfSound > 2000))
	{
		printf("Invalid parameter : WaterVelocityOfSound.\n");
		WaterVelocityOfSound = 1500;
	}
	if ((nb_circles < 0)||((int)circles_x.size() != nb_circles)||((int)circles_y.size() != nb_circles)||((int)circles_r.size() != nb_circles))
	{
		printf("Invalid parameter : nb_circles.\n");
		nb_circles = 0;
		circles_x.clear(); circles_y.clear(); circles_r.clear();
	}
	if ((nb_walls < 0)||((int)walls_xa.size() != nb_walls)||((int)walls_ya.size() != nb_walls)||((int)walls_xb.size() != nb_walls)||((int)walls_yb.size() != nb_walls))
	{
		printf("Invalid parameter : nb_walls.\n");
		nb_walls = 0;
		walls_xa.clear(); walls_ya.clear(); walls_xb.clear(); walls_yb.clear();
	}
	if ((box_env.IsEmpty())||(box_env[1].inf >= box_env[1].sup)||(box_env[2].inf >= box_env[2].sup))
	{
		printf("Invalid parameter : box_env.\n");
		box_env = box(interval(-10,10),interval(-10,10));
	}
	if ((csMap.xMin == csMap.xMax)||(csMap.yMin == csMap.yMax))
	{
		printf("Invalid parameter : csMap.\n");
		csMap.xMin = -10; csMap.xMax = 10; csMap.yMin = -10; csMap.yMax = 10; 
	}
#pragma endregion
	lat_home = lat_env; long_home = long_env; alt_home = alt_env;

	return EXIT_SUCCESS;
}